

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

RegOpnd * Lowerer::LoadGeneratorArgsPtr(Instr *instrInsert)

{
  Instr *pIVar1;
  RegOpnd *pRVar2;
  IndirOpnd *src;
  
  pIVar1 = LoadGeneratorObject(instrInsert);
  pRVar2 = IR::Opnd::AsRegOpnd(pIVar1->m_dst);
  src = IR::IndirOpnd::New(pRVar2,0x38,TyUint64,instrInsert->m_func,false);
  pRVar2 = IR::RegOpnd::New(TyInt64,instrInsert->m_func);
  InsertMove(&pRVar2->super_Opnd,&src->super_Opnd,instrInsert,true);
  return pRVar2;
}

Assistant:

IR::RegOpnd *
Lowerer::LoadGeneratorArgsPtr(IR::Instr *instrInsert)
{
    IR::Instr * instr = LoadGeneratorObject(instrInsert);
    IR::RegOpnd * generatorRegOpnd = instr->GetDst()->AsRegOpnd();

    IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(generatorRegOpnd, Js::JavascriptGenerator::GetArgsPtrOffset(), TyMachPtr, instrInsert->m_func);
    IR::RegOpnd * argsPtrOpnd = IR::RegOpnd::New(TyMachReg, instrInsert->m_func);
    Lowerer::InsertMove(argsPtrOpnd, indirOpnd, instrInsert);
    return argsPtrOpnd;
}